

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_flat.h
# Opt level: O0

size_t absl::lts_20250127::cord_internal::TagToAllocatedSize(uint8_t tag)

{
  undefined4 local_14;
  undefined4 local_10;
  uint8_t tag_local;
  
  if (tag < 0x43) {
    local_10 = (uint)tag * 8 + -0x10;
  }
  else {
    if (tag < 0xbb) {
      local_14 = (uint)tag * 0x40 + -0xe80;
    }
    else {
      local_14 = (uint)tag * 0x1000 + -0xb8000;
    }
    local_10 = local_14;
  }
  return (long)local_10;
}

Assistant:

constexpr size_t TagToAllocatedSize(uint8_t tag) {
  return (tag <= kTagBase + 512 / 8) ? tag * 8 - kTagBase * 8
         : (tag <= kTagBase + (512 / 8) + ((8192 - 512) / 64))
             ? 512 + tag * 64 - kTagBase * 64 - 512 / 8 * 64
             : 8192 + tag * 4096 - kTagBase * 4096 -
                   ((512 / 8) + ((8192 - 512) / 64)) * 4096;
}